

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2predicates.cc
# Opt level: O2

Vector3<long_double> *
s2pred::GetCircumcenter<long_double>
          (Vector3<long_double> *__return_storage_ptr__,Vector3<long_double> *a,
          Vector3<long_double> *b,Vector3<long_double> *c,longdouble *error)

{
  longdouble in_ST0;
  longdouble lVar1;
  longdouble lVar2;
  longdouble lVar3;
  Vector3<long_double> nbc;
  Vector3<long_double> nab;
  Vector3<long_double> bc_sum;
  Vector3<long_double> ab_sum;
  Vector3<long_double> mbc;
  Vector3<long_double> mab;
  Vector3<long_double> bc_diff;
  Vector3<long_double> ab_diff;
  FloatType local_1b8;
  longdouble local_1a8;
  longdouble local_198;
  FloatType local_188;
  longdouble local_178;
  longdouble local_168;
  longdouble local_158;
  longdouble local_148;
  longdouble local_138;
  longdouble local_128;
  longdouble local_118;
  longdouble local_108;
  Vector3<long_double> local_f8;
  Vector3<long_double> local_c8;
  FloatType local_98;
  longdouble local_88;
  longdouble local_78;
  FloatType local_68;
  longdouble local_58;
  longdouble local_48;
  
  util::math::internal_vector::BasicVector<Vector3,_long_double,_3UL>::operator-
            ((BasicVector<Vector3,_long_double,_3UL> *)a,b);
  util::math::internal_vector::BasicVector<Vector3,_long_double,_3UL>::operator+
            ((BasicVector<Vector3,_long_double,_3UL> *)a,b);
  util::math::internal_vector::BasicVector<Vector3,_long_double,_3UL>::operator-
            ((BasicVector<Vector3,_long_double,_3UL> *)b,c);
  util::math::internal_vector::BasicVector<Vector3,_long_double,_3UL>::operator+
            ((BasicVector<Vector3,_long_double,_3UL> *)b,c);
  local_188._0_10_ = local_58 * local_108 - local_48 * local_118;
  local_178 = local_48 * local_128 - local_108 * local_68._0_10_;
  local_168 = local_118 * local_68._0_10_ - local_128 * local_58;
  lVar1 = in_ST0;
  lVar2 = in_ST0;
  util::math::internal_vector::BasicVector<Vector3,_long_double,_3UL>::Norm
            (&local_188,(BasicVector<Vector3,_long_double,_3UL> *)b);
  util::math::internal_vector::BasicVector<Vector3,_long_double,_3UL>::Norm
            (&local_68,(BasicVector<Vector3,_long_double,_3UL> *)b);
  local_1b8._0_10_ = local_88 * local_138 - local_78 * local_148;
  local_1a8 = local_78 * local_158 - local_138 * local_98._0_10_;
  local_198 = local_148 * local_98._0_10_ - local_158 * local_88;
  lVar3 = lVar2;
  util::math::internal_vector::BasicVector<Vector3,_long_double,_3UL>::Norm
            (&local_1b8,(BasicVector<Vector3,_long_double,_3UL> *)b);
  util::math::internal_vector::BasicVector<Vector3,_long_double,_3UL>::Norm
            (&local_98,(BasicVector<Vector3,_long_double,_3UL> *)b);
  local_c8.c_[0]._0_10_ = local_178 * local_108 - local_168 * local_118;
  local_c8.c_[1]._0_10_ = local_168 * local_128 - local_108 * local_188._0_10_;
  local_c8.c_[2]._0_10_ = local_118 * local_188._0_10_ - local_128 * local_178;
  local_f8.c_[0]._0_10_ = local_1a8 * local_138 - local_198 * local_148;
  local_f8.c_[1]._0_10_ = local_198 * local_158 - local_138 * local_1b8._0_10_;
  local_f8.c_[2]._0_10_ = local_148 * local_1b8._0_10_ - local_158 * local_1a8;
  *error = (lVar2 + in_ST0) * (longdouble)1.3343234061987978e-33 +
           ((lVar3 + lVar1) * (longdouble)8.881784e-16 + (longdouble)3.1208336360941426e-18) *
           in_ST0 * lVar2 + (longdouble)4.4510473808249057e-67;
  Vector3<long_double>::CrossProd(&local_c8,&local_f8);
  return __return_storage_ptr__;
}

Assistant:

Vector3<T> GetCircumcenter(const Vector3<T>& a, const Vector3<T>& b,
                           const Vector3<T>& c, T* error) {
  constexpr T T_ERR = rounding_epsilon<T>();

  // We compute the circumcenter using the intersection of the perpendicular
  // bisectors of AB and BC.  The formula is essentially
  //
  //    Z = ((A x B) x (A + B)) x ((B x C) x (B + C)),
  //
  // except that we compute the cross product (A x B) as (A - B) x (A + B)
  // (and similarly for B x C) since this is much more stable when the inputs
  // are unit vectors.
  Vector3<T> ab_diff = a - b, ab_sum = a + b;
  Vector3<T> bc_diff = b - c, bc_sum = b + c;
  Vector3<T> nab = ab_diff.CrossProd(ab_sum);
  T nab_len = nab.Norm();
  T ab_len = ab_diff.Norm();
  Vector3<T> nbc = bc_diff.CrossProd(bc_sum);
  T nbc_len = nbc.Norm();
  T bc_len = bc_diff.Norm();
  Vector3<T> mab = nab.CrossProd(ab_sum);
  Vector3<T> mbc = nbc.CrossProd(bc_sum);
  *error = (((16 + 24 * sqrt(3)) * T_ERR +
                8 * DBL_ERR * (ab_len + bc_len)) * nab_len * nbc_len +
               128 * sqrt(3) * DBL_ERR * T_ERR * (nab_len + nbc_len) +
               3 * 4096 * DBL_ERR * DBL_ERR * T_ERR * T_ERR);
  return mab.CrossProd(mbc);
}